

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

void __thiscall QSimplex::dumpMatrix(QSimplex *this)

{
  QLatin1StringView latin1;
  char *pcVar1;
  long lVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  int j_1;
  qreal *row;
  int i;
  int j;
  QString str;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  QString *in_stack_fffffffffffffe08;
  QByteArrayView *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  QChar in_stack_fffffffffffffe1e;
  int iVar6;
  undefined8 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int iVar7;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar8;
  char local_1a8 [56];
  char local_170 [38];
  QChar local_14a;
  storage_type *local_148;
  undefined1 local_138 [54];
  QChar local_102;
  storage_type *local_100;
  undefined1 local_f0 [72];
  char local_a8 [38];
  QChar local_82;
  storage_type *local_80;
  undefined1 local_70 [48];
  QString local_40;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe04,
             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QMessageLogger::debug(local_28,"---- Simplex Matrix ----\n");
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffe08,
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  latin1.m_data._0_4_ = in_stack_fffffffffffffe38;
  latin1.m_size = in_stack_fffffffffffffe30;
  latin1.m_data._4_4_ = in_stack_fffffffffffffe3c;
  QString::QString((QString *)in_stack_fffffffffffffe10,latin1);
  for (iVar8 = 0; iVar8 < *(int *)(in_RDI + 0x3c); iVar8 = iVar8 + 1) {
    QByteArrayView::QByteArrayView<8ul>
              (in_stack_fffffffffffffe10,(char (*) [8])in_stack_fffffffffffffe08);
    QVar3.m_data = local_80;
    QVar3.m_size = (qsizetype)local_70;
    QString::fromLatin1(QVar3);
    in_stack_fffffffffffffe1c = (undefined2)iVar8;
    in_stack_fffffffffffffe1e.ucs = (char16_t)((uint)iVar8 >> 0x10);
    QChar::QChar<char16_t,_true>(&local_82,L' ');
    QString::arg<int,_true>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc,in_stack_fffffffffffffe1e);
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0xa5d1ba);
    QString::~QString((QString *)0xa5d1c7);
  }
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe04,
             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QtPrivate::asString(&local_40);
  QString::toLocal8Bit
            ((QString *)
             CONCAT26(in_stack_fffffffffffffe1e.ucs,
                      CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)));
  pcVar1 = QByteArray::constData((QByteArray *)0xa5d217);
  QMessageLogger::debug(local_a8,"%s",pcVar1);
  QByteArray::~QByteArray((QByteArray *)0xa5d23d);
  iVar8 = 0;
  while (iVar8 < *(int *)(in_RDI + 0x38)) {
    QByteArrayView::QByteArrayView<8ul>
              (in_stack_fffffffffffffe10,(char (*) [8])in_stack_fffffffffffffe08);
    QVar4.m_data = local_100;
    QVar4.m_size = (qsizetype)local_f0;
    QString::fromLatin1(QVar4);
    iVar7 = iVar8;
    QChar::QChar<char16_t,_true>(&local_102,L' ');
    QString::arg<int,_true>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc,in_stack_fffffffffffffe1e);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0xa5d2f1);
    QString::~QString((QString *)0xa5d2fe);
    lVar2 = *(long *)(in_RDI + 0x48) + (long)(iVar7 * *(int *)(in_RDI + 0x3c)) * 8;
    for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x3c); iVar6 = iVar6 + 1) {
      QByteArrayView::QByteArrayView<3ul>
                (in_stack_fffffffffffffe10,(char (*) [3])in_stack_fffffffffffffe08);
      QVar5.m_data = local_148;
      QVar5.m_size = (qsizetype)local_138;
      QString::fromLatin1(QVar5);
      in_stack_fffffffffffffe10 = *(QByteArrayView **)(lVar2 + (long)iVar6 * 8);
      QChar::QChar<char16_t,_true>(&local_14a,L' ');
      QString::arg<double,_true>
                ((QString *)
                 CONCAT26(in_stack_fffffffffffffe1e.ucs,CONCAT24(in_stack_fffffffffffffe1c,iVar8)),
                 (double)in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                 (char)((ulong)in_stack_fffffffffffffe08 >> 0x18),in_stack_fffffffffffffe04,
                 (QChar)(char16_t)((uint)iVar6 >> 0x10));
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QString::~QString((QString *)0xa5d3e6);
      QString::~QString((QString *)0xa5d3f3);
    }
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe04,
               (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QtPrivate::asString(&local_40);
    QString::toLocal8Bit
              ((QString *)
               CONCAT26(in_stack_fffffffffffffe1e.ucs,CONCAT24(in_stack_fffffffffffffe1c,iVar8)));
    pcVar1 = QByteArray::constData((QByteArray *)0xa5d443);
    QMessageLogger::debug(local_170,"%s",pcVar1);
    QByteArray::~QByteArray((QByteArray *)0xa5d469);
    iVar8 = iVar7 + 1;
  }
  pcVar1 = local_1a8;
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_fffffffffffffe10,pcVar1,0,
             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QMessageLogger::debug(pcVar1,"------------------------\n");
  QString::~QString((QString *)0xa5d4b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSimplex::dumpMatrix()
{
    qDebug("---- Simplex Matrix ----\n");

    QString str("       "_L1);
    for (int j = 0; j < columns; ++j)
        str += QString::fromLatin1("  <%1 >").arg(j, 2);
    qDebug("%s", qPrintable(str));
    for (int i = 0; i < rows; ++i) {
        str = QString::fromLatin1("Row %1:").arg(i, 2);

        qreal *row = matrix + i * columns;
        for (int j = 0; j < columns; ++j)
            str += QString::fromLatin1("%1").arg(row[j], 7, 'f', 2);
        qDebug("%s", qPrintable(str));
    }
    qDebug("------------------------\n");
}